

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattr_set.c
# Opt level: O2

int lattr_pset(uchar *val,mpt_convertable *src,int *def)

{
  int iVar1;
  uint8_t sym;
  int32_t tmp;
  
  if (src != (mpt_convertable *)0x0) {
    iVar1 = (*src->_vptr->convert)(src,0x79,&sym);
    if (iVar1 < 0) {
      tmp = (int32_t)*val;
      iVar1 = (*src->_vptr->convert)(src,0x69,&tmp);
      if (iVar1 < 0) {
        return iVar1;
      }
      if (0xff < (uint)tmp) {
        return -2;
      }
      sym = (uint8_t)tmp;
    }
    if (iVar1 != 0) {
      if ((int)(uint)sym < def[1]) {
        return -2;
      }
      if ((int)(uint)sym <= def[2]) {
        *val = sym;
        return 0;
      }
      return -2;
    }
  }
  *val = (uchar)*def;
  return 0;
}

Assistant:

static int lattr_pset(unsigned char *val, MPT_INTERFACE(convertable) *src, int def[3])
{
	int len;
	uint8_t sym;
	
	if (!src) {
		*val = def[0];
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'y', &sym)) < 0) {
		int32_t tmp = *val;
		if ((len = src->_vptr->convert(src, 'i', &tmp)) < 0) {
			return len;
		}
		if (tmp < 0 || tmp > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		sym = tmp;
	}
	if (!len) {
		*val = def[0];
		return 0;
	}
	if (sym < def[1] || sym > def[2]) {
		return MPT_ERROR(BadValue);
	}
	*val = sym;
	
	return 0;
}